

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

int xar_write_header(archive_write *a,archive_entry *entry)

{
  size_t sVar1;
  archive_entry *entry_00;
  bool bVar2;
  archive_string *dest;
  int iVar3;
  int iVar4;
  uint uVar5;
  mode_t mVar6;
  mode_t mVar7;
  archive_string_conv *paVar8;
  file_conflict *file;
  file_conflict *pfVar9;
  char *pcVar10;
  __off_t _Var11;
  uint64_t uVar12;
  la_int64_t lVar13;
  archive_digest *paVar14;
  int *piVar15;
  uint uVar16;
  char *extraout_RDX;
  char *fn;
  char *pathname;
  char *pcVar17;
  file_conflict *pfVar18;
  char *pcVar19;
  archive_rb_tree *rbt;
  long lVar20;
  char name [256];
  file_conflict *local_170;
  archive_string local_168;
  archive_string *local_150;
  archive_entry *local_148;
  char *local_140;
  char local_138 [264];
  
  piVar15 = (int *)a->format_data;
  piVar15[0x10] = 0;
  piVar15[0x11] = 0;
  piVar15[0x12] = 0;
  piVar15[0x13] = 0;
  if (*(long *)(piVar15 + 0x46) == 0) {
    paVar8 = archive_string_conversion_to_charset(&a->archive,"UTF-8",L'\x01');
    *(archive_string_conv **)(piVar15 + 0x46) = paVar8;
    if (paVar8 == (archive_string_conv *)0x0) {
      return -0x1e;
    }
  }
  file = file_new(a,entry);
  if (file == (file_conflict *)0x0) {
    pcVar10 = "Can\'t allocate data";
    iVar3 = 0xc;
    goto LAB_001668f3;
  }
  iVar3 = file_gen_utility_names(a,file);
  if (iVar3 < -0x14) {
    return iVar3;
  }
  if (((file->parentdir).length == 0) && ((file->basename).length == 0)) {
    file_free(file);
    return iVar3;
  }
  pcVar10 = (char *)a->format_data;
  sVar1 = (file->parentdir).length;
  if (sVar1 == 0) {
    pcVar19 = "";
  }
  else {
    pcVar19 = (file->parentdir).s;
  }
  local_148 = file->entry;
  pfVar18 = *(file_conflict **)(pcVar10 + 0x18);
  pcVar17 = pcVar10;
  local_170 = file;
  if ((*(size_t *)(pcVar10 + 0x30) == sVar1) &&
     (iVar4 = strcmp(((archive_string *)(pcVar10 + 0x28))->s,pcVar19), pcVar17 = extraout_RDX,
     iVar4 == 0)) {
    pfVar18 = *(file_conflict **)(pcVar10 + 0x20);
    iVar4 = __archive_rb_tree_insert_node(&pfVar18->rbtree,&file->rbnode);
    if (iVar4 == 0) {
      rbt = (archive_rb_tree *)(*(long *)(pcVar10 + 0x20) + 0x28);
LAB_00166d37:
      pfVar9 = (file_conflict *)__archive_rb_tree_find_node(rbt,(file->basename).s);
LAB_00166d49:
      mVar7 = archive_entry_filetype(pfVar9->entry);
      mVar6 = archive_entry_filetype(file->entry);
      entry_00 = pfVar9->entry;
      if (mVar7 == mVar6) {
        pfVar9->entry = file->entry;
        file->entry = entry_00;
        pfVar9->field_0x168 = pfVar9->field_0x168 & 0xfe;
        file_free(file);
        iVar4 = 0;
        bVar2 = true;
        local_170 = pfVar9;
      }
      else {
        pcVar10 = archive_entry_pathname(entry_00);
        archive_set_error(&a->archive,-1,
                          "Found duplicate entries `%s\' and its file type is different",pcVar10);
LAB_00166db1:
        file_free(file);
        iVar4 = -0x19;
LAB_00166dbe:
        bVar2 = false;
        local_170 = (file_conflict *)0x0;
      }
    }
    else {
      file->chnext = (file_conflict *)0x0;
      *(pfVar18->children).last = file;
      (pfVar18->children).last = &file->chnext;
      file->parent = pfVar18;
      iVar4 = 0;
      bVar2 = true;
    }
  }
  else {
    local_150 = (archive_string *)(pcVar10 + 0x28);
    uVar5 = get_path_component(local_138,(int)pcVar19,pcVar17);
    local_140 = pcVar19;
    if (uVar5 != 0) {
      do {
        if ((int)uVar5 < 0) {
          archive_set_error(&a->archive,-1,"A name buffer is too small");
          file_free(file);
          iVar4 = -0x1e;
          goto LAB_00166dbe;
        }
        pfVar9 = (file_conflict *)__archive_rb_tree_find_node(&pfVar18->rbtree,local_138);
        if (pfVar9 == (file_conflict *)0x0) break;
        if (*pcVar19 == '\0') goto LAB_00166a09;
        if ((pfVar9->field_0x168 & 2) == 0) {
          pcVar10 = archive_entry_pathname(pfVar9->entry);
          pcVar19 = archive_entry_pathname(file->entry);
          archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",pcVar10
                            ,pcVar19);
          goto LAB_00166db1;
        }
        pcVar19 = pcVar19 + (ulong)(pcVar19[uVar5] == '/') + (ulong)uVar5;
        uVar5 = get_path_component(local_138,(int)pcVar19,fn);
        pfVar18 = pfVar9;
      } while (uVar5 != 0);
    }
    pfVar9 = (file_conflict *)0x0;
LAB_00166a09:
    if (pfVar9 != (file_conflict *)0x0) goto LAB_00166d49;
    do {
      dest = local_150;
      if (*pcVar19 == '\0') {
        *(file_conflict **)(pcVar10 + 0x20) = pfVar18;
        pcVar10[0x30] = '\0';
        pcVar10[0x31] = '\0';
        pcVar10[0x32] = '\0';
        pcVar10[0x33] = '\0';
        pcVar10[0x34] = '\0';
        pcVar10[0x35] = '\0';
        pcVar10[0x36] = '\0';
        pcVar10[0x37] = '\0';
        archive_string_ensure
                  (local_150,(pfVar18->parentdir).length + (pfVar18->basename).length + 2);
        sVar1 = (pfVar18->parentdir).length;
        if ((pfVar18->basename).length + sVar1 == 0) {
          *dest->s = '\0';
        }
        else {
          if (sVar1 != 0) {
            pcVar10[0x30] = '\0';
            pcVar10[0x31] = '\0';
            pcVar10[0x32] = '\0';
            pcVar10[0x33] = '\0';
            pcVar10[0x34] = '\0';
            pcVar10[0x35] = '\0';
            pcVar10[0x36] = '\0';
            pcVar10[0x37] = '\0';
            archive_string_concat(dest,&pfVar18->parentdir);
            archive_strappend_char(dest,'/');
          }
          archive_string_concat(dest,&pfVar18->basename);
        }
        rbt = &pfVar18->rbtree;
        iVar4 = __archive_rb_tree_insert_node(rbt,&file->rbnode);
        if (iVar4 == 0) goto LAB_00166d37;
        file->chnext = (file_conflict *)0x0;
        *(pfVar18->children).last = file;
        (pfVar18->children).last = &file->chnext;
        file->parent = pfVar18;
        iVar4 = 0;
        bVar2 = true;
        goto LAB_00166dc1;
      }
      lVar20 = (long)(int)uVar5;
      local_168.s = (char *)0x0;
      local_168.length = 0;
      local_168.buffer_length = 0;
      archive_strncat(&local_168,local_140,(size_t)(pcVar19 + (lVar20 - (long)local_140)));
      if (*(char *)((long)local_168.s + (local_168.length - 1)) == '/') {
        *(undefined1 *)((long)local_168.s + (local_168.length - 1)) = 0;
        local_168.length = local_168.length - 1;
      }
      pfVar9 = file_create_virtual_dir(a,(xar_conflict *)local_168.s,pathname);
      archive_string_free(&local_168);
      if (pfVar9 == (file_conflict *)0x0) {
        iVar4 = 0xc;
        pcVar17 = "Can\'t allocate memory";
LAB_00166b5c:
        archive_set_error(&a->archive,iVar4,pcVar17);
        file_free(file);
        local_170 = (file_conflict *)0x0;
LAB_00166b76:
        bVar2 = false;
        pfVar9 = pfVar18;
      }
      else {
        iVar4 = file_gen_utility_names(a,pfVar9);
        if (iVar4 < -0x18) goto LAB_00166b76;
        iVar4 = __archive_rb_tree_insert_node(&pfVar18->rbtree,&pfVar9->rbnode);
        if (iVar4 != 0) {
          pfVar9->chnext = (file_conflict *)0x0;
          *(pfVar18->children).last = pfVar9;
          (pfVar18->children).last = &pfVar9->chnext;
          pfVar9->parent = pfVar18;
        }
        iVar4 = *(int *)(pcVar10 + 0x10);
        *(int *)(pcVar10 + 0x10) = iVar4 + 1;
        pfVar9->id = iVar4;
        pfVar9->next = (file_conflict *)0x0;
        **(undefined8 **)(pcVar10 + 0x101b0) = pfVar9;
        *(file_conflict ***)(pcVar10 + 0x101b0) = &pfVar9->next;
        pcVar19 = pcVar19 + (ulong)(pcVar19[lVar20] == '/') + lVar20;
        uVar5 = get_path_component(local_138,(int)pcVar19,pcVar10);
        bVar2 = true;
        if ((int)uVar5 < 0) {
          archive_string_free(&local_168);
          iVar4 = -1;
          pcVar17 = "A name buffer is too small";
          goto LAB_00166b5c;
        }
      }
      pfVar18 = pfVar9;
    } while (bVar2);
    iVar4 = -0x1e;
    bVar2 = false;
  }
LAB_00166dc1:
  if (!bVar2) {
    return iVar4;
  }
  if (local_170->entry != local_148) {
    return iVar3;
  }
  if (local_170->id == 0) {
    iVar4 = piVar15[4];
    piVar15[4] = iVar4 + 1;
    local_170->id = iVar4;
    local_170->next = (file_conflict *)0x0;
    **(undefined8 **)(piVar15 + 0x406c) = local_170;
    *(file_conflict ***)(piVar15 + 0x406c) = &local_170->next;
  }
  if ((local_170->field_0x168 & 1) != 0) {
    return iVar3;
  }
  if (*piVar15 == -1) {
    piVar15[2] = 0;
    piVar15[3] = 0;
    iVar4 = __archive_mktemp((char *)0x0);
    *piVar15 = iVar4;
    if (iVar4 < 0) {
      piVar15 = __errno_location();
      iVar3 = *piVar15;
      pcVar10 = "Couldn\'t create temporary file";
LAB_001668f3:
      archive_set_error(&a->archive,iVar3,pcVar10);
      return -0x1e;
    }
    uVar5 = 0;
    if (piVar15[0x20] == 1) {
      uVar5 = 0x14;
    }
    uVar16 = 0x10;
    if (piVar15[0x20] != 2) {
      uVar16 = uVar5;
    }
    if (uVar16 != 0) {
      _Var11 = lseek(iVar4,(ulong)uVar16,0);
      if (_Var11 < 0) {
        piVar15 = __errno_location();
        iVar3 = *piVar15;
        pcVar10 = "lseek failed";
        goto LAB_001668f3;
      }
      *(ulong *)(piVar15 + 2) = (ulong)uVar16;
    }
  }
  pcVar10 = archive_entry_hardlink(local_170->entry);
  if ((pcVar10 == (char *)0x0) && (iVar4 = save_xattrs(a,local_170), iVar4 != 0)) {
    return -0x1e;
  }
  mVar7 = archive_entry_filetype(local_170->entry);
  if (mVar7 != 0x8000) {
    return iVar3;
  }
  *(file_conflict **)(piVar15 + 0x10) = local_170;
  uVar5 = archive_entry_nlink(local_170->entry);
  if (1 < uVar5) {
    iVar4 = file_register_hardlink(a,local_170);
    if (iVar4 != 0) {
      return iVar4;
    }
    pcVar10 = archive_entry_hardlink(local_170->entry);
    if (pcVar10 != (char *)0x0) {
      archive_entry_unset_size(local_170->entry);
      return iVar3;
    }
  }
  (local_170->data).temp_offset = *(uint64_t *)(piVar15 + 2);
  uVar12 = archive_entry_size(local_170->entry);
  (local_170->data).size = uVar12;
  (local_170->data).compression = piVar15[0x22];
  lVar13 = archive_entry_size(local_170->entry);
  *(la_int64_t *)(piVar15 + 0x12) = lVar13;
  iVar4 = piVar15[0x21];
  piVar15[0x26] = iVar4;
  paVar14 = &__archive_digest;
  if (iVar4 == 1) {
    paVar14 = (archive_digest *)&__archive_digest.sha1init;
    lVar20 = 0xa8;
LAB_00166fa6:
    (*paVar14->md5init)((archive_sha1_ctx *)(lVar20 + (long)piVar15));
  }
  else if (iVar4 == 2) {
    lVar20 = 0xa0;
    goto LAB_00166fa6;
  }
  iVar4 = piVar15[0x21];
  piVar15[0x2c] = iVar4;
  paVar14 = &__archive_digest;
  if (iVar4 == 1) {
    paVar14 = (archive_digest *)&__archive_digest.sha1init;
    lVar20 = 0xc0;
  }
  else {
    if (iVar4 != 2) goto LAB_00166fe2;
    lVar20 = 0xb8;
  }
  (*paVar14->md5init)((archive_sha1_ctx *)((long)piVar15 + lVar20));
LAB_00166fe2:
  iVar4 = xar_compression_init_encoder(a);
  if (iVar4 != 0) {
    iVar3 = iVar4;
  }
  return iVar3;
}

Assistant:

static int
xar_write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct xar *xar;
	struct file *file;
	struct archive_entry *file_entry;
	int r, r2;

	xar = (struct xar *)a->format_data;
	xar->cur_file = NULL;
	xar->bytes_remaining = 0;

	if (xar->sconv == NULL) {
		xar->sconv = archive_string_conversion_to_charset(
		    &a->archive, "UTF-8", 1);
		if (xar->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	file = file_new(a, entry);
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data");
		return (ARCHIVE_FATAL);
	}
	r2 = file_gen_utility_names(a, file);
	if (r2 < ARCHIVE_WARN)
		return (r2);

	/*
	 * Ignore a path which looks like the top of directory name
	 * since we have already made the root directory of an Xar archive.
	 */
	if (archive_strlen(&(file->parentdir)) == 0 &&
	    archive_strlen(&(file->basename)) == 0) {
		file_free(file);
		return (r2);
	}

	/* Add entry into tree */
	file_entry = file->entry;
	r = file_tree(a, &file);
	if (r != ARCHIVE_OK)
		return (r);
	/* There is the same file in tree and
	 * the current file is older than the file in tree.
	 * So we don't need the current file data anymore. */
	if (file->entry != file_entry)
		return (r2);
	if (file->id == 0)
		file_register(xar, file);

	/* A virtual file, which is a directory, does not have
	 * any contents and we won't store it into a archive
	 * file other than its name. */
	if (file->virtual)
		return (r2);

	/*
	 * Prepare to save the contents of the file.
	 */
	if (xar->temp_fd == -1) {
		int algsize;
		xar->temp_offset = 0;
		xar->temp_fd = __archive_mktemp(NULL);
		if (xar->temp_fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't create temporary file");
			return (ARCHIVE_FATAL);
		}
		algsize = getalgsize(xar->opt_toc_sumalg);
		if (algsize > 0) {
			if (lseek(xar->temp_fd, algsize, SEEK_SET) < 0) {
				archive_set_error(&(a->archive), errno,
				    "lseek failed");
				return (ARCHIVE_FATAL);
			}
			xar->temp_offset = algsize;
		}
	}

	if (archive_entry_hardlink(file->entry) == NULL) {
		r = save_xattrs(a, file);
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* Non regular files contents are unneeded to be saved to
	 * a temporary file. */
	if (archive_entry_filetype(file->entry) != AE_IFREG)
		return (r2);

	/*
	 * Set the current file to cur_file to read its contents.
	 */
	xar->cur_file = file;

	if (archive_entry_nlink(file->entry) > 1) {
		r = file_register_hardlink(a, file);
		if (r != ARCHIVE_OK)
			return (r);
		if (archive_entry_hardlink(file->entry) != NULL) {
			archive_entry_unset_size(file->entry);
			return (r2);
		}
	}

	/* Save a offset of current file in temporary file. */
	file->data.temp_offset = xar->temp_offset;
	file->data.size = archive_entry_size(file->entry);
	file->data.compression = xar->opt_compression;
	xar->bytes_remaining = archive_entry_size(file->entry);
	checksum_init(&(xar->a_sumwrk), xar->opt_sumalg);
	checksum_init(&(xar->e_sumwrk), xar->opt_sumalg);
	r = xar_compression_init_encoder(a);

	if (r != ARCHIVE_OK)
		return (r);
	else
		return (r2);
}